

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.cpp
# Opt level: O1

Color4<double> * Imath_2_5::rgb2hsv_d(Color4<double> *c)

{
  double dVar1;
  double dVar2;
  Color4<double> *in_RDI;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = c->r;
  dVar2 = c->g;
  dVar6 = c->b;
  dVar3 = dVar1;
  if (dVar1 <= dVar2) {
    dVar3 = dVar2;
  }
  if (dVar3 <= dVar6) {
    dVar3 = dVar6;
  }
  dVar5 = dVar1;
  if (dVar2 <= dVar1) {
    dVar5 = dVar2;
  }
  if (dVar6 <= dVar5) {
    dVar5 = dVar6;
  }
  dVar5 = dVar3 - dVar5;
  dVar6 = 0.0;
  dVar4 = (double)(-(ulong)(dVar3 != 0.0) & (ulong)(dVar5 / dVar3));
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    if ((dVar1 != dVar3) || (NAN(dVar1) || NAN(dVar3))) {
      if ((dVar2 != dVar3) || (NAN(dVar2) || NAN(dVar3))) {
        dVar5 = (dVar1 - dVar2) / dVar5 + 4.0;
      }
      else {
        dVar5 = (c->b - dVar1) / dVar5 + 2.0;
      }
    }
    else {
      dVar5 = (dVar2 - c->b) / dVar5;
    }
    dVar5 = dVar5 / 6.0;
    dVar6 = (double)(~-(ulong)(dVar5 < 0.0) & (ulong)dVar5 |
                    (ulong)(dVar5 + 1.0) & -(ulong)(dVar5 < 0.0));
  }
  dVar1 = c->a;
  in_RDI->r = dVar6;
  in_RDI->g = dVar4;
  in_RDI->b = dVar3;
  in_RDI->a = dVar1;
  return in_RDI;
}

Assistant:

Color4<double>
rgb2hsv_d(const Color4<double> &c)
{
    const double &r = c.r;
    const double &g = c.g;
    const double &b = c.b;

    double max	 = (r > g) ? ((r > b) ? r : b) : ((g > b) ? g : b);
    double min	 = (r < g) ? ((r < b) ? r : b) : ((g < b) ? g : b);
    double range = max - min;
    double val	 = max;
    double sat   = 0;
    double hue   = 0;
    
    if (max != 0)   sat = range/max;
    
    if (sat != 0) 
    {
	double h;
	
	if      (r == max)	h =     (g - b) / range;
	else if (g == max)	h = 2 + (b - r) / range;
	else		h = 4 + (r - g) / range;

	hue = h/6.;
	    
	if (hue < 0.)
	    hue += 1.0;
    }
    return Color4<double>(hue,sat,val,c.a);
}